

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<std::__cxx11::string>
          (string *__return_storage_ptr__,OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  allocator<char> local_61;
  string local_60;
  string local_40;
  char *__s;
  
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,name);
  __s = (char *)CONCAT44(extraout_var,iVar1);
  if (__s != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar2);
    return __return_storage_ptr__;
  }
  reader = this->m_reader;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,name,&local_61);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  ThrowAttibuteError(reader,&local_40,&local_60);
}

Assistant:

std::string OgreXmlSerializer::ReadAttribute<std::string>(const char *name) const
{
    const char* value = m_reader->getAttributeValue(name);
    if (value)
    {
        return std::string(value);
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
        return "";
    }
}